

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O1

PointType __thiscall
Curve<3,_2>::atWithArcLengthParameterized
          (Curve<3,_2> *this,double *t,int *derivative_order,int *max_iter_time,double *arc_length_t
          )

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *in_R9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar4;
  PointType PVar5;
  double approx_t;
  anon_class_8_1_8991fb9c df;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double dStack_80;
  double *local_78;
  int *local_70;
  Curve<3,_2> *local_68;
  double local_60;
  double local_58;
  anon_class_8_1_8991fb9c local_50;
  undefined1 local_48 [16];
  
  dVar4 = *(double *)derivative_order;
  local_70 = max_iter_time;
  local_68 = this;
  if ((0.0 <= dVar4) && (dVar4 <= 1.0)) {
    local_58 = t[1] * dVar4;
    local_a0 = dVar4;
    local_78 = in_R9;
    local_50.this = (Curve<3,_2> *)t;
    if (0 < *(int *)arc_length_t) {
      iVar3 = 0;
      do {
        local_88 = 0.0;
        local_98 = 0.0001;
        local_90 = dVar4;
        dVar4 = NumericalQuadrature::
                adaptive_simpson_3_8<Curve<3,2>::atWithArcLengthParameterized(double_const&,int_const&,int_const&,double*)const::_lambda(double)_1_const&>
                          (&local_50,&local_88,&local_a0,&local_98);
        if (1e-06 <= ABS(dVar4 - local_58)) {
          local_98._0_4_ = 1;
          local_48._8_4_ = extraout_XMM0_Dc;
          local_48._0_8_ = dVar4 - local_58;
          local_48._12_4_ = extraout_XMM0_Dd;
          (**(code **)((long)*t + 0x10))(&local_88,t,&local_a0,&local_98);
          local_60 = SQRT(dStack_80 * dStack_80 + local_88 * local_88);
          local_98 = (double)CONCAT44(local_98._4_4_,2);
          (**(code **)((long)*t + 0x10))(&local_88,t,&local_a0,&local_98);
          local_a0 = local_a0 -
                     ((double)local_48._0_8_ * local_60) /
                     (SQRT(dStack_80 * dStack_80 + local_88 * local_88) * (double)local_48._0_8_ +
                     local_60 * local_60);
          bVar2 = 1e-06 <= ABS(local_a0 - local_90);
          dVar4 = local_a0;
          if (ABS(local_a0 - local_90) < 1e-06) {
            dVar4 = local_90;
          }
        }
        else {
          bVar2 = false;
          dVar4 = local_90;
        }
      } while ((bVar2) && (iVar3 = iVar3 + 1, iVar3 < *(int *)arc_length_t));
    }
    if (local_78 != (double *)0x0) {
      *local_78 = local_a0;
    }
    dVar1 = (double)(**(code **)((long)*t + 0x10))(local_68,t,&local_a0,local_70);
    PVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         dVar4;
    PVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         dVar1;
    return (PointType)
           PVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
    ;
  }
  __assert_fail("t >= 0.0 && t <= 1.0",
                "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/curve.hpp"
                ,0xad,
                "virtual PointType Curve<>::atWithArcLengthParameterized(const double &, const int &, const int &, double *) const [N = 3, PointDim = 2]"
               );
}

Assistant:

virtual auto atWithArcLengthParameterized(const double& t,
                                            const int& derivative_order = 0,
                                            const int& max_iter_time = 4,
                                            double* arc_length_t = nullptr) const -> PointType {
    assert(t >= 0.0 && t <= 1.0);

    double approx_t = t;
    double target_length = t * this->length_;
    double prev_approx_t = approx_t;

    const auto df = [&](double t) -> double { return this->at(t, 1).norm(); };

    for (int iter = 0; iter < max_iter_time; ++iter) {
      double approx_length = NumericalQuadrature::adaptive_simpson_3_8(df, 0, approx_t);
      double d = approx_length - target_length;
      if (abs(d) < EPS) {
        break;
      }

      // Newton's method
      double first_order = this->at(approx_t, 1).norm();
      double second_order = this->at(approx_t, 2).norm();
      double numerator = d * first_order;
      double denominator = d * second_order + first_order * first_order;

      approx_t = approx_t - numerator / denominator;

      if (abs(approx_t - prev_approx_t) < EPS) {
        {
          break;
        }
      } else {
        { prev_approx_t = approx_t; }
      }
    }
    if (arc_length_t != nullptr) {
      *arc_length_t = approx_t;
    }

    return this->at(approx_t, derivative_order);
  }